

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckNumber(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  int iVar1;
  Bool BVar2;
  char *local_28;
  tmbstr p;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
           (node->tag->id != TidyTag_FRAMESET)) ||
          ((((attval == (AttVal *)0x0 || (attval->dict == (Attribute *)0x0)) ||
            (attval->dict->id != TidyAttr_COLS)) &&
           (((attval == (AttVal *)0x0 || (attval->dict == (Attribute *)0x0)) ||
            (attval->dict->id != TidyAttr_ROWS)))))) {
    local_28 = attval->value;
    if ((((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_FONT))
       && ((*local_28 == '+' || (*local_28 == '-')))) {
      local_28 = local_28 + 1;
    }
    if (((attval->attribute != (tmbstr)0x0) &&
        (iVar1 = strcmp(attval->attribute,"tabindex"), iVar1 == 0)) && (*local_28 == '-')) {
      local_28 = local_28 + 1;
    }
    for (; *local_28 != '\0'; local_28 = local_28 + 1) {
      BVar2 = prvTidyIsDigit((int)*local_28);
      if (BVar2 == no) {
        prvTidyReportAttrError(doc,node,attval,0x22b);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckNumber( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check <frameset cols=... rows=...> */
    if ( nodeIsFRAMESET(node) &&
        (attrIsCOLS(attval) || attrIsROWS(attval)))
     return;

    p  = attval->value;
    
    /* font size may be preceded by + or - */
    if ( nodeIsFONT(node) && (*p == '+' || *p == '-') )
        ++p;
    /* tabindex may be preceeded by - */
    if (attval->attribute && (strcmp(attval->attribute,"tabindex") == 0) && (*p == '-'))
        ++p;

    while (*p)
    {
        if (!TY_(IsDigit)(*p))
        {
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
            break;
        }
        ++p;
    }
}